

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_mult_m0m1m0(REF_DBL *m1,REF_DBL *m2,REF_DBL *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  dVar1 = *m1;
  dVar2 = m1[1];
  dVar3 = *m2;
  dVar4 = m2[1];
  dVar5 = m1[2];
  dVar6 = m2[2];
  dVar15 = m1[3];
  dVar7 = m1[4];
  dVar13 = dVar7 * dVar6 + dVar2 * dVar3 + dVar4 * dVar15;
  dVar8 = m1[5];
  dVar9 = m2[3];
  dVar10 = m2[4];
  dVar16 = dVar5 * dVar10 + dVar1 * dVar4 + dVar2 * dVar9;
  dVar11 = m2[5];
  dVar17 = dVar5 * dVar11 + dVar1 * dVar6 + dVar2 * dVar10;
  dVar12 = dVar7 * dVar11 + dVar6 * dVar2 + dVar15 * dVar10;
  dVar14 = dVar1 * dVar3 + dVar2 * dVar4 + dVar5 * dVar6;
  dVar15 = dVar15 * dVar9 + dVar2 * dVar4 + dVar7 * dVar10;
  *m = dVar5 * dVar17 + dVar1 * dVar14 + dVar2 * dVar16;
  m[1] = m1[4] * dVar17 + m1[1] * dVar14 + m1[3] * dVar16;
  m[2] = dVar17 * m1[5] + dVar14 * m1[2] + dVar16 * m1[4];
  m[3] = m1[4] * dVar12 + m1[1] * dVar13 + m1[3] * dVar15;
  m[4] = dVar12 * m1[5] + dVar13 * m1[2] + dVar15 * m1[4];
  m[5] = (dVar8 * dVar11 + dVar7 * dVar10 + dVar5 * dVar6) * m1[5] +
         (dVar8 * dVar6 + dVar3 * dVar5 + dVar4 * dVar7) * m1[2] +
         (dVar8 * dVar10 + dVar4 * dVar5 + dVar9 * dVar7) * m1[4];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_mult_m0m1m0(REF_DBL *m1, REF_DBL *m2,
                                          REF_DBL *m) {
  REF_DBL product[9];
  /* first col */
  product[0] = m1[0] * m2[0] + m1[1] * m2[1] + m1[2] * m2[2];
  product[1] = m1[1] * m2[0] + m1[3] * m2[1] + m1[4] * m2[2];
  product[2] = m1[2] * m2[0] + m1[4] * m2[1] + m1[5] * m2[2];

  /* mid col */
  product[3] = m1[0] * m2[1] + m1[1] * m2[3] + m1[2] * m2[4];
  product[4] = m1[1] * m2[1] + m1[3] * m2[3] + m1[4] * m2[4];
  product[5] = m1[2] * m2[1] + m1[4] * m2[3] + m1[5] * m2[4];

  /* last col */
  product[6] = m1[0] * m2[2] + m1[1] * m2[4] + m1[2] * m2[5];
  product[7] = m1[1] * m2[2] + m1[3] * m2[4] + m1[4] * m2[5];
  product[8] = m1[2] * m2[2] + m1[4] * m2[4] + m1[5] * m2[5];

  m[0] = product[0] * m1[0] + product[3] * m1[1] + product[6] * m1[2];
  m[1] = product[0] * m1[1] + product[3] * m1[3] + product[6] * m1[4];
  m[2] = product[0] * m1[2] + product[3] * m1[4] + product[6] * m1[5];
  m[3] = product[1] * m1[1] + product[4] * m1[3] + product[7] * m1[4];
  m[4] = product[1] * m1[2] + product[4] * m1[4] + product[7] * m1[5];
  m[5] = product[2] * m1[2] + product[5] * m1[4] + product[8] * m1[5];

  return REF_SUCCESS;
}